

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O1

void libsgp4::SGP4::DeepSpaceSecular
               (double tsince,OrbitalElements *elements,CommonConstants *c_constants,
               DeepSpaceConstants *ds_constants,IntegratorParams *integ_params,double *xll,
               double *omgasm,double *xnodes,double *em,double *xinc,double *xn)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double __x;
  double dVar20;
  double dVar21;
  double dVar22;
  double __x_00;
  double __x_01;
  double dVar23;
  double dVar24;
  double local_a0;
  
  *xll = ds_constants->ssl * tsince + *xll;
  *omgasm = ds_constants->ssg * tsince + *omgasm;
  *xnodes = ds_constants->ssh * tsince + *xnodes;
  *em = ds_constants->sse * tsince + *em;
  *xinc = ds_constants->ssi * tsince + *xinc;
  if (ds_constants->shape != NONE) {
    if (((ABS(tsince) < 720.0) || (integ_params->atime * tsince <= 0.0)) ||
       (ABS(tsince) < ABS(integ_params->atime))) {
      integ_params->atime = 0.0;
      integ_params->xni = elements->recovered_mean_motion_;
      integ_params->xli = ds_constants->xlamo;
    }
    bVar4 = true;
    do {
      if (ds_constants->shape == SYNCHRONOUS) {
        dVar9 = ds_constants->del1;
        dVar5 = sin(integ_params->xli + -0.13130908);
        dVar24 = ds_constants->del2;
        dVar6 = integ_params->xli + -2.8843198;
        dVar7 = sin(dVar6 + dVar6);
        dVar6 = ds_constants->del3;
        dVar8 = sin((integ_params->xli + -0.37448087) * 3.0);
        local_a0 = dVar8 * dVar6 + dVar5 * dVar9 + dVar7 * dVar24;
        dVar9 = ds_constants->del1;
        dVar5 = cos(integ_params->xli + -0.13130908);
        dVar24 = ds_constants->del2;
        dVar6 = integ_params->xli + -2.8843198;
        dVar7 = cos(dVar6 + dVar6);
        dVar6 = ds_constants->del3;
        dVar8 = cos((integ_params->xli + -0.37448087) * 3.0);
        dVar9 = dVar8 * dVar6 * 3.0 + dVar5 * dVar9 + dVar7 * (dVar24 + dVar24);
      }
      else {
        dVar10 = c_constants->omgdot * integ_params->atime + elements->argument_perigee_;
        dVar22 = dVar10 + dVar10;
        dVar9 = integ_params->xli;
        dVar23 = dVar9 + dVar9;
        dVar24 = ds_constants->d2201;
        dVar11 = sin(dVar9 + dVar22 + -5.7686396);
        dVar9 = ds_constants->d2211;
        dVar12 = sin(integ_params->xli + -5.7686396);
        dVar6 = ds_constants->d3210;
        dVar13 = sin(integ_params->xli + dVar10 + -0.95240898);
        dVar5 = ds_constants->d3222;
        dVar14 = sin((integ_params->xli - dVar10) + -0.95240898);
        dVar7 = ds_constants->d4410;
        __x_00 = dVar22 + dVar23 + -1.8014998;
        dVar15 = sin(__x_00);
        dVar8 = ds_constants->d4422;
        dVar16 = sin(dVar23 + -1.8014998);
        dVar21 = ds_constants->d5220;
        dVar17 = sin(integ_params->xli + dVar10 + -1.050833);
        dVar1 = ds_constants->d5232;
        dVar18 = sin((integ_params->xli - dVar10) + -1.050833);
        dVar2 = ds_constants->d5421;
        __x_01 = dVar10 + dVar23 + -4.4108898;
        dVar19 = sin(__x_01);
        dVar3 = ds_constants->d5433;
        __x = (dVar23 - dVar10) + -4.4108898;
        dVar20 = sin(__x);
        local_a0 = dVar20 * dVar3 +
                   dVar19 * dVar2 +
                   dVar18 * dVar1 +
                   dVar17 * dVar21 +
                   dVar16 * dVar8 +
                   dVar15 * dVar7 +
                   dVar14 * dVar5 + dVar13 * dVar6 + dVar11 * dVar24 + dVar12 * dVar9;
        dVar9 = ds_constants->d2201;
        dVar11 = cos(dVar22 + integ_params->xli + -5.7686396);
        dVar24 = ds_constants->d2211;
        dVar12 = cos(integ_params->xli + -5.7686396);
        dVar6 = ds_constants->d3210;
        dVar13 = cos(integ_params->xli + dVar10 + -0.95240898);
        dVar5 = ds_constants->d3222;
        dVar14 = cos((integ_params->xli - dVar10) + -0.95240898);
        dVar7 = ds_constants->d5220;
        dVar15 = cos(integ_params->xli + dVar10 + -1.050833);
        dVar8 = ds_constants->d5232;
        dVar10 = cos((integ_params->xli - dVar10) + -1.050833);
        dVar21 = ds_constants->d4410;
        dVar16 = cos(__x_00);
        dVar1 = ds_constants->d4422;
        dVar17 = cos(dVar23 + -1.8014998);
        dVar2 = ds_constants->d5421;
        dVar18 = cos(__x_01);
        dVar3 = ds_constants->d5433;
        dVar19 = cos(__x);
        dVar21 = dVar19 * dVar3 + dVar18 * dVar2 + dVar16 * dVar21 + dVar17 * dVar1;
        dVar9 = dVar21 + dVar21 +
                dVar10 * dVar8 +
                dVar15 * dVar7 + dVar14 * dVar5 + dVar13 * dVar6 + dVar11 * dVar9 + dVar12 * dVar24;
      }
      dVar24 = integ_params->xni;
      dVar6 = ds_constants->xfact + dVar24;
      dVar5 = tsince - integ_params->atime;
      if (720.0 <= ABS(dVar5)) {
        dVar5 = *(double *)(&DAT_0010aa80 + (ulong)(0.0 <= dVar5) * 8);
        integ_params->xli = local_a0 * 259200.0 + dVar6 * dVar5 + integ_params->xli;
        integ_params->xni = dVar9 * dVar6 * 259200.0 + local_a0 * dVar5 + dVar24;
        integ_params->atime = integ_params->atime + dVar5;
      }
      else {
        *xn = dVar9 * dVar6 * dVar5 * dVar5 * 0.5 + dVar24 + local_a0 * dVar5;
        dVar6 = local_a0 * dVar5 * dVar5 * 0.5 + dVar6 * dVar5 + integ_params->xli;
        dVar24 = tsince * 0.0043752690880113 + ds_constants->gsto;
        dVar9 = floor(dVar24 / 6.283185307179586);
        dVar24 = dVar9 * -6.283185307179586 + dVar24;
        if (ds_constants->shape == SYNCHRONOUS) {
          dVar6 = ((dVar6 + dVar24) - *xnodes) - *omgasm;
        }
        else {
          dVar24 = dVar24 - *xnodes;
          dVar6 = dVar6 + dVar24 + dVar24;
        }
        *xll = dVar6;
        bVar4 = false;
      }
    } while (bVar4);
  }
  return;
}

Assistant:

void SGP4::DeepSpaceSecular(
        const double tsince,
        const OrbitalElements& elements,
        const CommonConstants& c_constants,
        const DeepSpaceConstants& ds_constants,
        IntegratorParams& integ_params,
        double& xll,
        double& omgasm,
        double& xnodes,
        double& em,
        double& xinc,
        double& xn)
{
    static const double G22 = 5.7686396;
    static const double G32 = 0.95240898;
    static const double G44 = 1.8014998;
    static const double G52 = 1.0508330;
    static const double G54 = 4.4108898;
    static const double FASX2 = 0.13130908;
    static const double FASX4 = 2.8843198;
    static const double FASX6 = 0.37448087;

    static const double STEP = 720.0;
    static const double STEP2 = 259200.0;

    xll += ds_constants.ssl * tsince;
    omgasm += ds_constants.ssg * tsince;
    xnodes += ds_constants.ssh * tsince;
    em += ds_constants.sse * tsince;
    xinc += ds_constants.ssi * tsince;

    if (ds_constants.shape != DeepSpaceConstants::NONE)
    {
        double xndot = 0.0;
        double xnddt = 0.0;
        double xldot = 0.0;
        /*
         * 1st condition (if tsince is less than one time step from epoch)
         * 2nd condition (if atime and
         *     tsince are of opposite signs, so zero crossing required)
         * 3rd condition (if tsince is closer to zero than 
         *     atime, only integrate away from zero)
         */
        if (fabs(tsince) < STEP ||
            tsince * integ_params.atime <= 0.0 ||
            fabs(tsince) < fabs(integ_params.atime))
        {
            // restart back at the epoch
            integ_params.atime = 0.0;
            // TODO: check
            integ_params.xni = elements.RecoveredMeanMotion();
            // TODO: check
            integ_params.xli = ds_constants.xlamo;
        }

        bool running = true;
        while (running)
        {
            // always calculate dot terms ready for integration beginning
            // from the start of the range which is 'atime'
            if (ds_constants.shape == DeepSpaceConstants::SYNCHRONOUS)
            {
                xndot = ds_constants.del1 * sin(integ_params.xli - FASX2)
                    + ds_constants.del2 * sin(2.0 * (integ_params.xli - FASX4))
                    + ds_constants.del3 * sin(3.0 * (integ_params.xli - FASX6));
                xnddt = ds_constants.del1 * cos(integ_params.xli - FASX2)
                    + 2.0 * ds_constants.del2 * cos(2.0 * (integ_params.xli - FASX4))
                    + 3.0 * ds_constants.del3 * cos(3.0 * (integ_params.xli - FASX6));
            }
            else
            {
                // TODO: check
                const double xomi = elements.ArgumentPerigee() + c_constants.omgdot * integ_params.atime;
                const double x2omi = xomi + xomi;
                const double x2li = integ_params.xli + integ_params.xli;
                xndot = ds_constants.d2201 * sin(x2omi + integ_params.xli - G22)
                    + ds_constants.d2211 * sin(integ_params.xli - G22)
                    + ds_constants.d3210 * sin(xomi + integ_params.xli - G32)
                    + ds_constants.d3222 * sin(-xomi + integ_params.xli - G32)
                    + ds_constants.d4410 * sin(x2omi + x2li - G44)
                    + ds_constants.d4422 * sin(x2li - G44)
                    + ds_constants.d5220 * sin(xomi + integ_params.xli - G52)
                    + ds_constants.d5232 * sin(-xomi + integ_params.xli - G52)
                    + ds_constants.d5421 * sin(xomi + x2li - G54)
                    + ds_constants.d5433 * sin(-xomi + x2li - G54);
                xnddt = ds_constants.d2201 * cos(x2omi + integ_params.xli - G22)
                    + ds_constants.d2211 * cos(integ_params.xli - G22)
                    + ds_constants.d3210 * cos(xomi + integ_params.xli - G32)
                    + ds_constants.d3222 * cos(-xomi + integ_params.xli - G32)
                    + ds_constants.d5220 * cos(xomi + integ_params.xli - G52)
                    + ds_constants.d5232 * cos(-xomi + integ_params.xli - G52)
                    + 2.0 * (ds_constants.d4410 * cos(x2omi + x2li - G44)
                    + ds_constants.d4422 * cos(x2li - G44)
                    + ds_constants.d5421 * cos(xomi + x2li - G54)
                    + ds_constants.d5433 * cos(-xomi + x2li - G54));
            }
            xldot = integ_params.xni + ds_constants.xfact;
            xnddt *= xldot;

            double ft = tsince - integ_params.atime;
            if (fabs(ft) >= STEP)
            {
                const double delt = (ft >= 0.0 ? STEP : -STEP);
                // integrate by a full step ('delt'), updating the cached
                // values for the new 'atime'
                integ_params.xli = integ_params.xli + xldot * delt + xndot * STEP2;
                integ_params.xni = integ_params.xni + xndot * delt + xnddt * STEP2;
                integ_params.atime += delt;
            }
            else
            {
                // integrate by the difference 'ft' remaining
                xn = integ_params.xni + xndot * ft
                    + xnddt * ft * ft * 0.5;
                const double xl_temp = integ_params.xli + xldot * ft
                    + xndot * ft * ft * 0.5;

                const double theta = Util::WrapTwoPI(ds_constants.gsto + tsince * kTHDT);
                if (ds_constants.shape == DeepSpaceConstants::SYNCHRONOUS)
                {
                    xll = xl_temp + theta - xnodes - omgasm;
                }
                else
                {
                    xll = xl_temp + 2.0 * (theta - xnodes);
                }
                running = false;
            }
        }
    }
}